

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::RemoveLast
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  uint32 uVar2;
  CppType CVar3;
  MapFieldBase *this_00;
  
  if (*(Descriptor **)(field + 0x58) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"RemoveLast","Field does not match message type.");
  }
  if (*(int *)(field + 0x4c) != 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"RemoveLast",
               "Field is singular; the method requires a repeated field.");
  }
  if (field[0x50] != (FieldDescriptor)0x1) {
    CVar3 = FieldDescriptor::cpp_type(field);
    switch(CVar3) {
    case CPPTYPE_INT32:
    case CPPTYPE_ENUM:
      uVar2 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
      RepeatedField<int>::RemoveLast
                ((RepeatedField<int> *)
                 ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2));
      return;
    case CPPTYPE_INT64:
      uVar2 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
      RepeatedField<long>::RemoveLast
                ((RepeatedField<long> *)
                 ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2));
      return;
    case CPPTYPE_UINT32:
      uVar2 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
      RepeatedField<unsigned_int>::RemoveLast
                ((RepeatedField<unsigned_int> *)
                 ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2));
      return;
    case CPPTYPE_UINT64:
      uVar2 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
      RepeatedField<unsigned_long>::RemoveLast
                ((RepeatedField<unsigned_long> *)
                 ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2));
      return;
    case CPPTYPE_DOUBLE:
      uVar2 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
      RepeatedField<double>::RemoveLast
                ((RepeatedField<double> *)
                 ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2));
      return;
    case CPPTYPE_FLOAT:
      uVar2 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
      RepeatedField<float>::RemoveLast
                ((RepeatedField<float> *)
                 ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2));
      return;
    case CPPTYPE_BOOL:
      uVar2 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
      RepeatedField<bool>::RemoveLast
                ((RepeatedField<bool> *)
                 ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2));
      return;
    case CPPTYPE_STRING:
      uVar2 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
      RepeatedPtrFieldBase::
      RemoveLast<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                ((RepeatedPtrFieldBase *)
                 ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2));
      return;
    case CPPTYPE_MESSAGE:
      goto switchD_005efd28_caseD_a;
    default:
      return;
    }
  }
  uVar2 = ReflectionSchema::GetExtensionSetOffset(&this->schema_);
  ExtensionSet::RemoveLast
            ((ExtensionSet *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),
             *(int *)(field + 0x38));
  return;
switchD_005efd28_caseD_a:
  bVar1 = FieldDescriptor::is_map(field);
  uVar2 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
  this_00 = (MapFieldBase *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2);
  if (bVar1) {
    this_00 = (MapFieldBase *)MapFieldBase::MutableRepeatedField(this_00);
  }
  RepeatedPtrFieldBase::
  RemoveLast<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
            ((RepeatedPtrFieldBase *)this_00);
  return;
}

Assistant:

void GeneratedMessageReflection::RemoveLast(
    Message* message,
    const FieldDescriptor* field) const {
  USAGE_CHECK_MESSAGE_TYPE(RemoveLast);
  USAGE_CHECK_REPEATED(RemoveLast);

  if (field->is_extension()) {
    MutableExtensionSet(message)->RemoveLast(field->number());
  } else {
    switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                                     \
      case FieldDescriptor::CPPTYPE_##UPPERCASE :                             \
        MutableRaw<RepeatedField<LOWERCASE> >(message, field)->RemoveLast();  \
        break

      HANDLE_TYPE( INT32,  int32);
      HANDLE_TYPE( INT64,  int64);
      HANDLE_TYPE(UINT32, uint32);
      HANDLE_TYPE(UINT64, uint64);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE( FLOAT,  float);
      HANDLE_TYPE(  BOOL,   bool);
      HANDLE_TYPE(  ENUM,    int);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_STRING:
        switch (field->options().ctype()) {
          default:  // TODO(kenton):  Support other string reps.
          case FieldOptions::STRING:
            MutableRaw<RepeatedPtrField<string> >(message, field)->RemoveLast();
            break;
        }
        break;

      case FieldDescriptor::CPPTYPE_MESSAGE:
        if (IsMapFieldInApi(field)) {
          MutableRaw<MapFieldBase>(message, field)
              ->MutableRepeatedField()
              ->RemoveLast<GenericTypeHandler<Message> >();
        } else {
          MutableRaw<RepeatedPtrFieldBase>(message, field)
            ->RemoveLast<GenericTypeHandler<Message> >();
        }
        break;
    }
  }
}